

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O3

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
bulk_load(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
          *this,V *values,int num_keys,LinearModel<int> *pretrained_model,bool train_with_sample)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  double dVar6;
  double dVar7;
  uint uVar8;
  uint uVar9;
  double *pdVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  int *piVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined8 in_XMM8_Qb;
  
  initialize(this,num_keys,0.7);
  if (num_keys == 0) {
    this->expansion_threshold_ = (double)this->data_capacity_;
    this->contraction_threshold_ = 0.0;
    if (0 < this->data_capacity_) {
      piVar15 = this->key_slots_;
      lVar14 = 0;
      do {
        piVar15[lVar14] = 0x7fffffff;
        lVar14 = lVar14 + 1;
      } while (lVar14 < this->data_capacity_);
    }
  }
  else {
    if (pretrained_model == (LinearModel<int> *)0x0) {
      pretrained_model = &(this->super_AlexNode<int,_int>).model_;
      build_model(values,num_keys,pretrained_model,train_with_sample);
      pdVar10 = &(this->super_AlexNode<int,_int>).model_.b_;
    }
    else {
      pdVar10 = &pretrained_model->b_;
    }
    iVar12 = this->data_capacity_;
    dVar6 = ((double)iVar12 / (double)num_keys) * pretrained_model->a_;
    dVar7 = ((double)iVar12 / (double)num_keys) * *pdVar10;
    (this->super_AlexNode<int,_int>).model_.a_ = dVar6;
    (this->super_AlexNode<int,_int>).model_.b_ = dVar7;
    if (num_keys < 1) {
      iVar19 = -1;
    }
    else {
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      piVar2 = this->key_slots_;
      piVar3 = this->payload_slots_;
      puVar4 = this->bitmap_;
      piVar15 = &values->second;
      uVar20 = 0xffffffff;
      uVar16 = 0;
      uVar17 = (ulong)(uint)num_keys;
      uVar18 = num_keys;
      do {
        iVar12 = values[uVar16].first;
        iVar1 = this->data_capacity_;
        iVar19 = (int)uVar20;
        uVar9 = iVar19 + 1;
        auVar33._0_8_ = (double)iVar12;
        auVar33._8_8_ = in_XMM8_Qb;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar6;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = dVar7;
        auVar28 = vfmadd213sd_fma(auVar33,auVar28,auVar30);
        uVar13 = (uint)auVar28._0_8_;
        uVar8 = uVar13;
        if ((int)uVar13 < (int)uVar9) {
          uVar8 = uVar9;
        }
        uVar20 = (ulong)uVar8;
        if ((int)(iVar1 - uVar8) < (int)uVar18) {
          iVar12 = iVar1 - uVar18;
          lVar14 = (long)iVar12;
          if ((int)uVar9 < iVar12) {
            uVar20 = (ulong)iVar19;
            auVar24 = vpbroadcastd_avx512f();
            lVar21 = uVar20 + 2;
            if ((long)(uVar20 + 2) < lVar14) {
              lVar21 = lVar14;
            }
            uVar11 = 0;
            auVar25 = vpbroadcastq_avx512f();
            do {
              auVar26 = vpbroadcastq_avx512f();
              auVar27 = vporq_avx512f(auVar26,auVar22);
              auVar26 = vporq_avx512f(auVar26,auVar23);
              vpcmpuq_avx512f(auVar26,auVar25,2);
              vpcmpuq_avx512f(auVar27,auVar25,2);
              auVar26 = vmovdqu32_avx512f(auVar24);
              *(undefined1 (*) [64])(piVar2 + uVar20 + uVar11 + 1) = auVar26;
              uVar11 = uVar11 + 0x10;
            } while ((lVar21 + 0xf + ~uVar20 & 0xfffffffffffffff0) != uVar11);
          }
          puVar5 = this->bitmap_;
          uVar20 = 0;
          do {
            piVar2[((long)iVar1 + uVar20) - (long)(int)uVar18] = piVar15[uVar20 * 2 + -1];
            piVar3[((long)iVar1 + uVar20) - (long)(int)uVar18] = piVar15[uVar20 * 2];
            if ((iVar12 < 0) ||
               (uVar11 = lVar14 + uVar20, (long)this->data_capacity_ <= (long)uVar11))
            goto LAB_00128684;
            uVar20 = uVar20 + 1;
            puVar5[uVar11 >> 6 & 0x3ffffff] =
                 puVar5[uVar11 >> 6 & 0x3ffffff] | 1L << (uVar11 & 0x3f);
          } while (uVar17 != uVar20);
          uVar20 = (ulong)((int)uVar20 + ~uVar18 + iVar1);
          uVar9 = uVar18;
        }
        else {
          if ((int)uVar9 < (int)uVar13) {
            auVar24 = vpbroadcastd_avx512f();
            auVar25 = vpbroadcastq_avx512f();
            uVar11 = 0;
            do {
              auVar26 = vpbroadcastq_avx512f();
              auVar27 = vporq_avx512f(auVar26,auVar22);
              auVar26 = vporq_avx512f(auVar26,auVar23);
              vpcmpuq_avx512f(auVar26,auVar25,2);
              vpcmpuq_avx512f(auVar27,auVar25,2);
              auVar26 = vmovdqu32_avx512f(auVar24);
              *(undefined1 (*) [64])(piVar2 + (long)iVar19 + uVar11 + 1) = auVar26;
              uVar11 = uVar11 + 0x10;
            } while (((ulong)((uVar8 - iVar19) - 2) + 0x10 & 0xfffffffffffffff0) != uVar11);
          }
          piVar2[(int)uVar8] = iVar12;
          piVar3[(int)uVar8] = values[uVar16].second;
          if (((int)uVar8 < 0) || (this->data_capacity_ <= (int)uVar8)) {
LAB_00128684:
            __assert_fail("pos >= 0 && pos < data_capacity_",
                          "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex_nodes.h"
                          ,0x1e4,
                          "void alex::AlexDataNode<int, int>::set_bit(int) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                         );
          }
          puVar4[uVar8 >> 6] = puVar4[uVar8 >> 6] | 1L << (uVar20 & 0x3f);
          uVar9 = uVar18 - 1;
        }
        iVar19 = (int)uVar20;
        if ((int)(iVar1 - uVar8) < (int)uVar18) break;
        uVar16 = uVar16 + 1;
        piVar15 = piVar15 + 2;
        uVar17 = uVar17 - 1;
        uVar18 = uVar9;
      } while (uVar16 != (uint)num_keys);
      iVar12 = this->data_capacity_;
    }
    if (iVar19 + 1 < iVar12) {
      piVar15 = this->key_slots_;
      lVar14 = (long)iVar19 + 1;
      do {
        piVar15[lVar14] = 0x7fffffff;
        lVar14 = lVar14 + 1;
        iVar12 = this->data_capacity_;
      } while (lVar14 < iVar12);
    }
    auVar29._0_8_ = (double)iVar12;
    auVar29._8_8_ = in_XMM8_Qb;
    auVar32._0_8_ = (double)(num_keys + 1);
    auVar32._8_8_ = in_XMM8_Qb;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = auVar29._0_8_ * 0.8;
    auVar28 = vmaxsd_avx(auVar32,auVar31);
    auVar28 = vminsd_avx(auVar29,auVar28);
    this->expansion_threshold_ = auVar28._0_8_;
    this->contraction_threshold_ = auVar29._0_8_ * 0.6;
    this->min_key_ = values->first;
    this->max_key_ = values[(long)num_keys + -1].first;
  }
  return;
}

Assistant:

void bulk_load(const V values[], int num_keys,
                 const LinearModel<T>* pretrained_model = nullptr,
                 bool train_with_sample = false) {
    initialize(num_keys, kInitDensity_);

    if (num_keys == 0) {
      expansion_threshold_ = data_capacity_;
      contraction_threshold_ = 0;
      for (int i = 0; i < data_capacity_; i++) {
        ALEX_DATA_NODE_KEY_AT(i) = kEndSentinel_;
      }
      return;
    }

    // Build model
    if (pretrained_model != nullptr) {
      this->model_.a_ = pretrained_model->a_;
      this->model_.b_ = pretrained_model->b_;
    } else {
      build_model(values, num_keys, &(this->model_), train_with_sample);
    }
    this->model_.expand(static_cast<double>(data_capacity_) / num_keys);

    // Model-based inserts
    int last_position = -1;
    int keys_remaining = num_keys;
    for (int i = 0; i < num_keys; i++) {
      int position = this->model_.predict(values[i].first);
      position = std::max<int>(position, last_position + 1);

      int positions_remaining = data_capacity_ - position;
      if (positions_remaining < keys_remaining) {
        // fill the rest of the store contiguously
        int pos = data_capacity_ - keys_remaining;
        for (int j = last_position + 1; j < pos; j++) {
          ALEX_DATA_NODE_KEY_AT(j) = values[i].first;
        }
        for (int j = i; j < num_keys; j++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
          key_slots_[pos] = values[j].first;
          payload_slots_[pos] = values[j].second;
#else
          data_slots_[pos] = values[j];
#endif
          set_bit(pos);
          pos++;
        }
        last_position = pos - 1;
        break;
      }

      for (int j = last_position + 1; j < position; j++) {
        ALEX_DATA_NODE_KEY_AT(j) = values[i].first;
      }

#if ALEX_DATA_NODE_SEP_ARRAYS
      key_slots_[position] = values[i].first;
      payload_slots_[position] = values[i].second;
#else
      data_slots_[position] = values[i];
#endif
      set_bit(position);

      last_position = position;

      keys_remaining--;
    }

    for (int i = last_position + 1; i < data_capacity_; i++) {
      ALEX_DATA_NODE_KEY_AT(i) = kEndSentinel_;
    }

    expansion_threshold_ = std::min(std::max(data_capacity_ * kMaxDensity_,
                                             static_cast<double>(num_keys + 1)),
                                    static_cast<double>(data_capacity_));
    contraction_threshold_ = data_capacity_ * kMinDensity_;
    min_key_ = values[0].first;
    max_key_ = values[num_keys - 1].first;
  }